

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

token * logical_and_expression(dmr_C *C,token *token,expression **tree)

{
  position pVar1;
  int iVar2;
  token *ptVar3;
  expression *peVar4;
  char *pcVar5;
  expression *peVar6;
  expression *local_48;
  expression *right;
  expression *local_38;
  expression *left;
  
  local_38 = (expression *)0x0;
  ptVar3 = bitwise_or_expression(C,token,&local_38);
  if (local_38 != (expression *)0x0) {
    peVar6 = local_38;
    right = (expression *)tree;
    do {
      tree = (expression **)right;
      if (((ulong)ptVar3->pos & 0x3f) != 0x11) goto LAB_0010901f;
      local_48 = (expression *)0x0;
      iVar2 = 4;
      if ((ptVar3->field_2).special == 0x10c) {
        pVar1 = ptVar3->pos;
        peVar4 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *(undefined1 *)peVar4 = 7;
        peVar4->pos = pVar1;
        ptVar3 = bitwise_or_expression(C,ptVar3->next,&local_48);
        if (local_48 == (expression *)0x0) {
          pcVar5 = dmrC_show_special(C,0x10c);
          dmrC_sparse_error(C,ptVar3->pos,"No right hand side of \'%s\'-expression",pcVar5);
          iVar2 = 3;
        }
        else {
          peVar4->field_0x1 =
               (byte)((ushort)*(undefined2 *)peVar6 >> 8) &
               (byte)((ushort)*(undefined2 *)local_48 >> 8) & 1;
          peVar4->op = 0x10c;
          (peVar4->field_5).field_3.unop = peVar6;
          (peVar4->field_5).field_2.string = (string *)local_48;
          iVar2 = 0;
          peVar6 = peVar4;
          local_38 = peVar4;
        }
      }
    } while (iVar2 == 0);
    tree = (expression **)right;
    if (1 < iVar2 - 3U) {
      return ptVar3;
    }
  }
LAB_0010901f:
  *tree = local_38;
  return ptVar3;
}

Assistant:

static struct token *logical_and_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_LOGICAL, bitwise_or_expression,
		(op == SPECIAL_LOGICAL_AND)
	);
}